

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters ZVar1;
  U32 UVar2;
  ZSTD_useRowMatchFinderMode_e ZVar3;
  ZSTD_CCtx_params *in_RDI;
  uint uStack0000000000000008;
  uint uStack000000000000000c;
  ZSTD_CCtx_params *cctxParams;
  
  ZSTD_CCtxParams_init(in_RDI,3);
  ZVar1 = cParams;
  (in_RDI->cParams).windowLog = uStack0000000000000008;
  (in_RDI->cParams).chainLog = uStack000000000000000c;
  (in_RDI->cParams).hashLog = cParams.windowLog;
  (in_RDI->cParams).searchLog = cParams.chainLog;
  cParams._8_8_ = ZVar1._8_8_;
  (in_RDI->cParams).minMatch = cParams.hashLog;
  (in_RDI->cParams).targetLength = cParams.searchLog;
  cParams.minMatch = ZVar1.minMatch;
  (in_RDI->cParams).strategy = cParams.minMatch;
  cParams = ZVar1;
  UVar2 = ZSTD_CParams_shouldEnableLdm((ZSTD_compressionParameters *)&stack0x00000008);
  if (UVar2 != 0) {
    (in_RDI->ldmParams).enableLdm = 1;
    ZSTD_ldm_adjustParameters(&in_RDI->ldmParams,(ZSTD_compressionParameters *)&stack0x00000008);
  }
  UVar2 = ZSTD_CParams_useBlockSplitter((ZSTD_compressionParameters *)&stack0x00000008);
  if (UVar2 != 0) {
    in_RDI->splitBlocks = 1;
  }
  ZVar3 = ZSTD_resolveRowMatchFinderMode
                    (in_RDI->useRowMatchFinder,(ZSTD_compressionParameters *)&stack0x00000008);
  in_RDI->useRowMatchFinder = ZVar3;
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    if (ZSTD_CParams_shouldEnableLdm(&cParams)) {
        DEBUGLOG(4, "ZSTD_makeCCtxParamsFromCParams(): Including LDM into cctx params");
        cctxParams.ldmParams.enableLdm = 1;
        /* LDM is enabled by default for optimal parser and window size >= 128MB */
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }

    if (ZSTD_CParams_useBlockSplitter(&cParams)) {
        DEBUGLOG(4, "ZSTD_makeCCtxParamsFromCParams(): Including block splitting into cctx params");
        cctxParams.splitBlocks = 1;
    }

    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}